

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_node.cpp
# Opt level: O2

size_t la::trie_node::convertIndex(char *c)

{
  char cVar1;
  byte bVar2;
  
  cVar1 = *c;
  bVar2 = cVar1 + 0x9f;
  if (0x19 < bVar2) {
    if ((byte)(cVar1 - 0x30U) < 10) {
      bVar2 = cVar1 + 0x2aU & 0x3f;
    }
    else if (cVar1 == '_') {
      bVar2 = 0x25;
    }
    else if (cVar1 == '.') {
      bVar2 = 0x27;
    }
    else {
      if (cVar1 != ',') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/charleswu52[P]LA_CPlusPlus/src/levenshtein_automaton/trie_node.cpp"
                      ,0x1f,"static std::size_t la::trie_node::convertIndex(const char &)");
      }
      bVar2 = 0x26;
    }
  }
  return (ulong)bVar2;
}

Assistant:

std::size_t
    trie_node::convertIndex(const char &c)
    {
        if ('a' <= c && c <= 'z')
            return c - 'a';
        if ('0' <= c && c <= '9')
            return c - '0' + 26;
        if (c == '_')
            return 26 + 10 + 1;
        if (c == ',')
            return 26 + 10 + 2;
        if (c == '.')
            return 26 + 10 + 3;
        assert(false);
        return 0;
    }